

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_json_schema.cpp
# Opt level: O1

string * flatbuffers::jsons::anon_unknown_1::GenFullName<flatbuffers::EnumDef>
                   (string *__return_storage_ptr__,EnumDef *enum_def)

{
  Namespace *pNVar1;
  pointer pcVar2;
  pointer pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_58 [2];
  long local_48 [2];
  EnumDef *local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pNVar1 = (enum_def->super_Definition).defined_namespace;
  pbVar3 = (pNVar1->components).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = enum_def;
  if (pbVar3 != (pNVar1->components).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pcVar2 = (pbVar3->_M_dataplus)._M_p;
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_58,pcVar2,pcVar2 + pbVar3->_M_string_length);
      std::__cxx11::string::append((char *)local_58);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      pbVar3 = pbVar3 + 1;
    } while (pbVar3 != (pNVar1->components).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::__cxx11::string::_M_append
            ((char *)__return_storage_ptr__,
             (ulong)(local_38->super_Definition).name._M_dataplus._M_p);
  return __return_storage_ptr__;
}

Assistant:

static std::string GenFullName(const T *enum_def) {
  std::string full_name;
  const auto &name_spaces = enum_def->defined_namespace->components;
  for (auto ns = name_spaces.cbegin(); ns != name_spaces.cend(); ++ns) {
    full_name.append(*ns + "_");
  }
  full_name.append(enum_def->name);
  return full_name;
}